

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void lua_createtable(lua_State *L,int narray,int nrec)

{
  StkId pSVar1;
  Table *t_00;
  Table *x_;
  TValue *io;
  Table *t;
  int nrec_local;
  int narray_local;
  lua_State *L_local;
  
  t_00 = luaH_new(L);
  pSVar1 = (L->top).p;
  *(Table **)pSVar1 = t_00;
  (pSVar1->val).tt_ = 'E';
  (L->top).p = (StkId)((L->top).offset + 0x10);
  if ((0 < narray) || (0 < nrec)) {
    luaH_resize(L,t_00,narray,nrec);
  }
  if (L->l_G->GCdebt < 1) {
    luaC_step(L);
  }
  return;
}

Assistant:

LUA_API void lua_createtable (lua_State *L, int narray, int nrec) {
  Table *t;
  lua_lock(L);
  t = luaH_new(L);
  sethvalue2s(L, L->top.p, t);
  api_incr_top(L);
  if (narray > 0 || nrec > 0)
    luaH_resize(L, t, cast_uint(narray), cast_uint(nrec));
  luaC_checkGC(L);
  lua_unlock(L);
}